

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O2

double beta_cdf_inv(double cdf,double p,double q)

{
  char *pcVar1;
  ulong uVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double b;
  double dVar7;
  double dVar8;
  double dVar9;
  double x;
  double local_48;
  
  if (p <= 0.0) {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"BETA_CDF_INV - Fatal error!\n");
    pcVar1 = "  P <= 0.0\n";
  }
  else if (q <= 0.0) {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"BETA_CDF_INV - Fatal error!\n");
    pcVar1 = "  Q <= 0.0\n";
  }
  else {
    if ((0.0 <= cdf) && (cdf <= 1.0)) {
      if ((cdf == 0.0) && (!NAN(cdf))) {
        return 0.0;
      }
      if ((cdf == 1.0) && (!NAN(cdf))) {
        return 1.0;
      }
      uVar2 = -(ulong)(0.5 < cdf);
      local_48 = p;
      if (0.5 < cdf) {
        cdf = 1.0 - cdf;
        local_48 = q;
      }
      b = (double)(~uVar2 & (ulong)q | uVar2 & (ulong)p);
      dVar3 = log(cdf * cdf);
      if (-0.0 < dVar3) {
        dVar3 = sqrt(-dVar3);
      }
      else {
        dVar3 = SQRT(-dVar3);
      }
      dVar3 = dVar3 - (dVar3 * 0.27061 + 2.30753) / ((dVar3 * 0.04481 + 0.99229) * dVar3 + 1.0);
      if ((local_48 <= 1.0) || (b <= 1.0)) {
        dVar4 = 1.0 / (b * 9.0);
        if (dVar4 < 0.0) {
          dVar6 = sqrt(dVar4);
        }
        else {
          dVar6 = SQRT(dVar4);
        }
        dVar3 = pow(dVar3 * dVar6 + (1.0 - dVar4),3.0);
        dVar3 = dVar3 * (b + b);
        if (dVar3 <= 0.0) {
          dVar3 = log((1.0 - cdf) * b);
          dVar3 = exp((dVar3 + 0.0) / b);
          dVar3 = 1.0 - dVar3;
        }
        else {
          dVar3 = (local_48 * 4.0 + b + b + -2.0) / dVar3;
          if (dVar3 <= 1.0) {
            dVar3 = log(cdf * local_48);
            dVar3 = exp((dVar3 + 0.0) / local_48);
          }
          else {
            dVar3 = -2.0 / (dVar3 + 1.0) + 1.0;
          }
        }
      }
      else {
        dVar6 = (dVar3 * dVar3 + -3.0) / 6.0;
        dVar9 = 1.0 / (local_48 + local_48 + -1.0);
        dVar8 = 1.0 / (b + b + -1.0);
        dVar7 = 2.0 / (dVar9 + dVar8);
        dVar4 = dVar7 + dVar6;
        if (dVar4 < 0.0) {
          dVar4 = sqrt(dVar4);
        }
        else {
          dVar4 = SQRT(dVar4);
        }
        dVar3 = (dVar3 * dVar4) / dVar7 -
                (-2.0 / (dVar7 * 3.0) + dVar6 + 0.8333333333333334) * (dVar8 - dVar9);
        dVar3 = exp(dVar3 + dVar3);
        dVar3 = local_48 / (dVar3 * b + local_48);
      }
      dVar4 = 0.0001;
      if (0.0001 <= dVar3) {
        dVar4 = dVar3;
      }
      dVar3 = 0.9999;
      if (dVar4 <= 0.9999) {
        dVar3 = dVar4;
      }
      dVar4 = pow(cdf,0.2);
      dVar4 = r8_max(((-5.0 / local_48) / local_48 - 1.0 / dVar4) + -13.0,-37.0);
      dVar6 = pow(10.0,(double)(int)dVar4);
      dVar7 = 1.0;
      dVar8 = 1.0;
      dVar4 = 0.0;
LAB_001947c4:
      x = dVar3;
      dVar3 = beta_inc(local_48,b,x);
      dVar9 = log(x);
      dVar5 = log(1.0 - x);
      dVar9 = exp(dVar5 * (1.0 - b) + dVar9 * (1.0 - local_48) + 0.0);
      dVar9 = dVar9 * (dVar3 - cdf);
      if (dVar4 * dVar9 <= 0.0) {
        dVar7 = r8_max(dVar8,1e-37);
      }
      dVar4 = 1.0;
      do {
        dVar3 = dVar9 * dVar4;
        dVar8 = dVar3 * dVar3;
        if (((dVar8 < dVar7) && (dVar3 = x - dVar3, 0.0 <= dVar3)) && (dVar3 <= 1.0)) {
          if ((dVar7 <= dVar6) || (dVar9 * dVar9 <= dVar6)) goto LAB_0019492d;
          if (((dVar3 != 0.0) || (NAN(dVar3))) && ((dVar3 != 1.0 || (NAN(dVar3)))))
          goto LAB_00194917;
        }
        dVar4 = dVar4 / 3.0;
      } while( true );
    }
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"BETA_CDF_INV - Fatal error!\n");
    pcVar1 = "  CDF < 0.0 or 1.0 < CDF\n";
  }
  std::operator<<((ostream *)&std::cerr,pcVar1);
  return -1.0;
LAB_00194917:
  dVar4 = dVar9;
  if ((dVar3 == x) && (!NAN(dVar3) && !NAN(x))) {
LAB_0019492d:
    return (double)(~uVar2 & (ulong)x | (ulong)(1.0 - x) & uVar2);
  }
  goto LAB_001947c4;
}

Assistant:

double beta_cdf_inv ( double cdf, double p, double q )

//****************************************************************************80
//
//  Purpose:
//
//    BETA_CDF_INV inverts the Beta CDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    28 April 2013
//
//  Author:
//
//    Original FORTRAN77 version by GW Cran, KJ Martin, GE Thomas.
//    C++ version by John Burkardt.
//
//  Reference:
//
//    GW Cran, KJ Martin, GE Thomas,
//    Remark AS R19 and Algorithm AS 109:
//    A Remark on Algorithms AS 63: The Incomplete Beta Integral
//    and AS 64: Inverse of the Incomplete Beta Integeral,
//    Applied Statistics,
//    Volume 26, Number 1, 1977, pages 111-114.
//
//  Parameters:
//
//    Input, double CDF, the value of the incomplete Beta
//    function.  0 <= CDF <= 1.
//
//    Input, double P, Q, the parameters of the incomplete
//    Beta function.
//
//    Output, double BETA_CDF_INV, the argument of the Beta CDF which 
//    produces the value CDF.
//
//  Local Parameters:
//
//    Local, double SAE, the most negative decimal exponent
//    which does not cause an underflow.
//
{
  double a;
  double acu;
  double adj;
  double beta_log = 0.0;
  double fpu;
  double g;
  double h;
  int iex;
  bool indx;
  double pp;
  double prev;
  double qq;
  double r;
  double s;
  double sae = -37.0;
  double sq;
  double t;
  double tx;
  double value;
  double w;
  double xin;
  double y;
  double yprev;

  fpu = pow ( 10.0, sae );
//
//  Test for admissibility of parameters.
//
  if ( p <= 0.0 )
  {
    cerr << "\n";
    cerr << "BETA_CDF_INV - Fatal error!\n";
    cerr << "  P <= 0.0\n";
    value = -1.0;
    return value;
  }

  if ( q <= 0.0 )
  {
    cerr << "\n";
    cerr << "BETA_CDF_INV - Fatal error!\n";
    cerr << "  Q <= 0.0\n";
    value = -1.0;
    return value;
  }

  if ( cdf < 0.0 || 1.0 < cdf )
  {
    cerr << "\n";
    cerr << "BETA_CDF_INV - Fatal error!\n";
    cerr << "  CDF < 0.0 or 1.0 < CDF\n";
    value = -1.0;
    return value;
  }
//
//  Return immediately if the answer is easy.
//
  if ( cdf == 0.0 )
  {
    value = 0.0;
    return value;
  }
  if ( cdf == 1.0 )
  {
    value = 1.0;
    return value;
  }
//
//  Change tail if necessary.
//
  if ( 0.5 < cdf )
  {
    a = 1.0 - cdf;
    pp = q;
    qq = p;
    indx = true;
  }
  else
  {
    a = cdf;
    pp = p;
    qq = q;
    indx = false;
  }
//
//  Calculate the initial approximation.
//
  r = sqrt ( - log ( a * a ) );

  y = r - ( 2.30753 + 0.27061 * r ) 
    / ( 1.0 + ( 0.99229 + 0.04481 * r ) * r );

  if ( 1.0 < pp && 1.0 < qq )
  {
    r = ( y * y - 3.0 ) / 6.0;
    s = 1.0 / ( pp + pp - 1.0 );
    t = 1.0 / ( qq + qq - 1.0 );
    h = 2.0 / ( s + t );
    w = y * sqrt ( h + r ) / h - ( t - s ) 
      * ( r + 5.0 / 6.0 - 2.0 / ( 3.0 * h ) );
    value = pp / ( pp + qq * exp ( w + w ) );
  }
  else
  {
    r = qq + qq;
    t = 1.0 / ( 9.0 * qq );
    t = r * pow ( 1.0 - t + y * sqrt ( t ), 3 );

    if ( t <= 0.0 )
    {
      value = 1.0 - exp ( ( log ( ( 1.0 - a ) * qq ) + beta_log ) / qq );
    }
    else
    {
      t = ( 4.0 * pp + r - 2.0 ) / t;

      if ( t <= 1.0 )
      {
        value = exp ( ( log ( a * pp ) + beta_log ) / pp );
      }
      else
      {
        value = 1.0 - 2.0 / ( t + 1.0 );
      }
    }
  }
//
//  Solve for X by a modified Newton-Raphson method.
//
  r = 1.0 - pp;
  t = 1.0 - qq;
  yprev = 0.0;
  sq = 1.0;
  prev = 1.0;

  if ( value < 0.0001 )
  {
    value = 0.0001;
  }

  if ( 0.9999 < value )
  {
    value = 0.9999;
  }

  iex = r8_max ( - 5.0 / pp / pp - 1.0 / pow ( a, 0.2 ) - 13.0, sae );

  acu = pow ( 10.0, iex );

  for ( ; ; )
  {
    y = beta_inc ( pp, qq, value );

    xin = value;
    y = ( y - a ) * exp ( beta_log + r * log ( xin ) + t * log ( 1.0 - xin ) );

    if ( y * yprev <= 0.0 )
    {
      prev = r8_max ( sq, fpu );
    }

    g = 1.0;

    for ( ; ; )
    {
      for ( ; ; )
      {
        adj = g * y;
        sq = adj * adj;

        if ( sq < prev )
        {
          tx = value - adj;

          if ( 0.0 <= tx && tx <= 1.0 )
          {
            break;
          }
        }
        g = g / 3.0;
      }

      if ( prev <= acu )
      {
        if ( indx )
        {
          value = 1.0 - value;
        }
        return value;
      }

      if ( y * y <= acu )
      {
        if ( indx )
        {
          value = 1.0 - value;
        }
        return value;
      }

      if ( tx != 0.0 && tx != 1.0 )
      {
        break;
      }

      g = g / 3.0;
    }

    if ( tx == value )
    {
      break;
    }

    value = tx;
    yprev = y;
  }

  if ( indx )
  {
    value = 1.0 - value;
  }

  return value;
}